

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.h
# Opt level: O2

bool __thiscall
Js::TinyDictionary::TryGetValue<Memory::WriteBarrierPtr<Js::PropertyRecord_const>*>
          (TinyDictionary *this,PropertyId key,PropertyIndex *index,
          WriteBarrierPtr<const_Js::PropertyRecord> **data)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint uVar4;
  byte bVar6;
  ulong uVar5;
  
  bVar6 = *(byte *)((long)this->bucketsData + ((ulong)((long)key * -0x61c8864680b583eb) >> 0x3c));
  if (bVar6 == 0xff) {
LAB_00aeb75a:
    bVar2 = false;
  }
  else {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      uVar4 = bVar6 & 0x7f;
      uVar5 = (ulong)uVar4;
      if (((*data)[uVar5].ptr)->pid == key) break;
      if ((char)bVar6 < '\0') goto LAB_00aeb75a;
      bVar6 = *(byte *)((long)this[1].bucketsData + uVar5);
      if ((bVar6 & 0x7f) == (byte)uVar4 && bVar6 != 0xff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                    ,0x59,"(next[idx] == NIL || (next[idx] & 127) != idx)",
                                    "next[idx] == NIL || (next[idx] & 127) != idx");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
        bVar6 = *(byte *)((long)this[1].bucketsData + uVar5);
      }
    }
    *index = (PropertyIndex)uVar4;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

inline bool TryGetValue(PropertyId key, PropertyIndex* index, const Data& data)
        {
            byte* buckets = reinterpret_cast<byte*>(bucketsData);
            uint32 bucketIndex = ReduceKeyToIndex(key);

            byte i = buckets[bucketIndex];
            if (i != NIL)
            {
                for(;;)
                {                    
                    byte idx = i & 127; // strip the sentinel bit

                    if (data[idx]->GetPropertyId() == key)
                    {
                        *index = idx;
                        return true;
                    }

                    if (i & 128)
                    {
                        // this was the last value in the chain
                        break;
                    }

                    Assert(next[idx] == NIL || (next[idx] & 127) != idx);
                    i = next[idx];
                }
            }

            return false;
        }